

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

void __thiscall
miniros::ServicePublication::ServicePublication
          (ServicePublication *this,string *name,string *md5sum,string *data_type,
          string *request_data_type,string *response_data_type,ServiceCallbackHelperPtr *helper,
          CallbackQueueInterface *callback_queue,VoidConstPtr *tracked_object)

{
  (this->super_enable_shared_from_this<miniros::ServicePublication>)._M_weak_this.
  super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::ServicePublication>)._M_weak_this.
  super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__cxx11::string::string((string *)&this->md5sum_,(string *)md5sum);
  std::__cxx11::string::string((string *)&this->data_type_,(string *)data_type);
  std::__cxx11::string::string((string *)&this->request_data_type_,(string *)request_data_type);
  std::__cxx11::string::string((string *)&this->response_data_type_,(string *)response_data_type);
  std::__shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->helper_).
              super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>,
             &helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
            );
  this->dropped_ = false;
  (this->client_links_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->client_links_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->client_links_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->client_links_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->client_links_mutex_).super___mutex_base._M_mutex.__align = 0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->callback_queue_ = callback_queue;
  this->has_tracked_object_ = false;
  std::__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void_const,void>
            ((__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2> *)&this->tracked_object_,
             &tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
  if ((tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    this->has_tracked_object_ = true;
  }
  return;
}

Assistant:

ServicePublication::ServicePublication(const std::string& name, const std::string &md5sum, const std::string& data_type, const std::string& request_data_type,
                             const std::string& response_data_type, const ServiceCallbackHelperPtr& helper, CallbackQueueInterface* callback_queue,
                             const VoidConstPtr& tracked_object)
: name_(name)
, md5sum_(md5sum)
, data_type_(data_type)
, request_data_type_(request_data_type)
, response_data_type_(response_data_type)
, helper_(helper)
, dropped_(false)
, callback_queue_(callback_queue)
, has_tracked_object_(false)
, tracked_object_(tracked_object)
{
  if (tracked_object)
  {
    has_tracked_object_ = true;
  }
}